

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::GenerateFromSchema
          (LuaBfbsGenerator *this,Schema *schema,CodeGenOptions *options)

{
  bool bVar1;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *enums;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *objects;
  Object *root_object;
  CodeGenOptions *options_local;
  Schema *schema_local;
  LuaBfbsGenerator *this_local;
  
  CodeGenOptions::operator=(&this->options_,options);
  enums = reflection::Schema::enums(schema);
  bVar1 = GenerateEnums(this,enums);
  if (bVar1) {
    objects = reflection::Schema::objects(schema);
    root_object = reflection::Schema::root_table(schema);
    bVar1 = GenerateObjects(this,objects,root_object);
    if (bVar1) {
      this_local._4_4_ = OK;
    }
    else {
      this_local._4_4_ = ERROR;
    }
  }
  else {
    this_local._4_4_ = ERROR;
  }
  return this_local._4_4_;
}

Assistant:

Status GenerateFromSchema(const r::Schema *schema,
                            const CodeGenOptions &options)
      FLATBUFFERS_OVERRIDE {
    options_ = options;
    if (!GenerateEnums(schema->enums())) { return ERROR; }
    if (!GenerateObjects(schema->objects(), schema->root_table())) {
      return ERROR;
    }
    return OK;
  }